

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookbook.c
# Opt level: O0

void readimage(void)

{
  int iVar1;
  char local_1015 [8];
  char filename [13];
  float buffer [1000];
  float local_60;
  float nullval;
  float datamax;
  float datamin;
  long ii;
  long npixels;
  long nbuffer;
  long fpixel;
  long naxes [2];
  undefined1 local_1c [4];
  undefined1 local_18 [4];
  int anynull;
  int nfound;
  int status;
  fitsfile *fptr;
  
  builtin_strncpy(local_1015,"atestfil",8);
  builtin_strncpy(filename,".fit",5);
  anynull = 0;
  iVar1 = ffopentest(10,&nfound,local_1015,0,&anynull);
  if (iVar1 != 0) {
    printerror(anynull);
  }
  iVar1 = ffgknj(_nfound,"NAXIS",1,2,&fpixel,local_18,&anynull);
  if (iVar1 != 0) {
    printerror(anynull);
  }
  nbuffer = 1;
  buffer[999] = 0.0;
  nullval = 1e+30;
  local_60 = -1e+30;
  for (ii = fpixel * naxes[0]; 0 < ii; ii = ii - npixels) {
    npixels = ii;
    if (1000 < ii) {
      npixels = 1000;
    }
    iVar1 = ffgpv(_nfound,0x2a,nbuffer,npixels,buffer + 999,filename + 5,local_1c,&anynull);
    if (iVar1 != 0) {
      printerror(anynull);
    }
    for (_datamax = 0; _datamax < npixels; _datamax = _datamax + 1) {
      if (buffer[_datamax + -2] < nullval) {
        nullval = buffer[_datamax + -2];
      }
      if (local_60 < buffer[_datamax + -2]) {
        local_60 = buffer[_datamax + -2];
      }
    }
    nbuffer = npixels + nbuffer;
  }
  printf("\nMin and max image pixels =  %.0f, %.0f\n",(double)nullval,(double)local_60);
  iVar1 = ffclos(_nfound,&anynull);
  if (iVar1 != 0) {
    printerror(anynull);
  }
  return;
}

Assistant:

void readimage( void )

    /************************************************************************/
    /* Read a FITS image and determine the minimum and maximum pixel values */
    /************************************************************************/
{
    fitsfile *fptr;       /* pointer to the FITS file, defined in fitsio.h */
    int status,  nfound, anynull;
    long naxes[2], fpixel, nbuffer, npixels, ii;

#define buffsize 1000
    float datamin, datamax, nullval, buffer[buffsize];
    char filename[]  = "atestfil.fit";     /* name of existing FITS file   */

    status = 0;

    if ( fits_open_file(&fptr, filename, READONLY, &status) )
         printerror( status );

    /* read the NAXIS1 and NAXIS2 keyword to get image size */
    if ( fits_read_keys_lng(fptr, "NAXIS", 1, 2, naxes, &nfound, &status) )
         printerror( status );

    npixels  = naxes[0] * naxes[1];         /* number of pixels in the image */
    fpixel   = 1;
    nullval  = 0;                /* don't check for null values in the image */
    datamin  = 1.0E30f;
    datamax  = -1.0E30f;

    while (npixels > 0)
    {
      nbuffer = npixels;
      if (npixels > buffsize)
        nbuffer = buffsize;     /* read as many pixels as will fit in buffer */

      /* Note that even though the FITS images contains unsigned integer */
      /* pixel values (or more accurately, signed integer pixels with    */
      /* a bias of 32768),  this routine is reading the values into a    */
      /* float array.   Cfitsio automatically performs the datatype      */
      /* conversion in cases like this.                                  */

      if ( fits_read_img(fptr, TFLOAT, fpixel, nbuffer, &nullval,
                  buffer, &anynull, &status) )
           printerror( status );

      for (ii = 0; ii < nbuffer; ii++)  {
        if ( buffer[ii] < datamin )
            datamin = buffer[ii];

        if ( buffer[ii] > datamax )
            datamax = buffer[ii];
      }
      npixels -= nbuffer;    /* increment remaining number of pixels */
      fpixel  += nbuffer;    /* next pixel to be read in image */
    }

    printf("\nMin and max image pixels =  %.0f, %.0f\n", datamin, datamax);

    if ( fits_close_file(fptr, &status) )
         printerror( status );

    return;
}